

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::TexCubeCompletenessCase::iterate(TexCubeCompletenessCase *this)

{
  RenderContext *context;
  byte bVar1;
  int x;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 seed;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *log_00;
  char *pcVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference texCoord_00;
  undefined1 local_108 [7];
  bool isOk;
  CubeFace local_dc;
  int local_d8;
  int face;
  int offsetY;
  int offsetX;
  Random random;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_98 [8];
  Surface renderedFrame;
  TextureRenderer renderer;
  TestLog *log;
  bool allFacesOk;
  int viewportHeight;
  int viewportWidth;
  TexCubeCompletenessCase *this_local;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar3));
  iVar3 = de::min<int>(0x40,iVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar4));
  iVar4 = de::min<int>(0x40,iVar4);
  bVar1 = 1;
  log_00 = tcu::TestContext::getLog(this->m_testCtx);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            ((TextureRenderer *)&renderedFrame.m_pixels.m_cap,this->m_renderCtx,log_00,
             GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  tcu::Surface::Surface((Surface *)local_98,iVar3,iVar4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z);
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar6);
  de::Random::Random((Random *)&offsetY,seed);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_01,iVar5));
  iVar5 = de::max<int>(0,iVar5 + -0x40);
  face = de::Random::getInt((Random *)&offsetY,0,iVar5);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar5));
  iVar5 = de::max<int>(0,iVar5 + -0x40);
  local_d8 = de::Random::getInt((Random *)&offsetY,0,iVar5);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])();
  for (local_dc = CUBEFACE_NEGATIVE_X; (int)local_dc < 6; local_dc = local_dc + CUBEFACE_POSITIVE_X)
  {
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z,local_dc);
    glwViewport(face,local_d8,iVar3,iVar4);
    texCoord_00 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              ((TextureRenderer *)&renderedFrame.m_pixels.m_cap,0,texCoord_00,TEXTURETYPE_CUBE);
    x = face;
    iVar5 = local_d8;
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_108,(Surface *)local_98);
    glu::readPixels(context,x,iVar5,(PixelBufferAccess *)local_108);
    bVar2 = compareToConstantColor
                      (log_00,"Result","Image comparison result",(Surface *)local_98,
                       COMPARE_LOG_RESULT,(RGBA)(this->m_compareColor).m_value);
    if (!bVar2) {
      bVar1 = 0;
    }
  }
  pcVar6 = "Image comparison failed";
  if (bVar1 != 0) {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult(this->m_testCtx,(uint)(byte)~bVar1,pcVar6);
  de::Random::~Random((Random *)&offsetY);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&random.m_rnd.z);
  tcu::Surface::~Surface((Surface *)local_98);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer
            ((TextureRenderer *)&renderedFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

TexCubeCompletenessCase::IterateResult TexCubeCompletenessCase::iterate (void)
{
	int					viewportWidth	= de::min(64, m_renderCtx.getRenderTarget().getWidth());
	int					viewportHeight	= de::min(64, m_renderCtx.getRenderTarget().getHeight());
	bool				allFacesOk		= true;
	TestLog&			log				= m_testCtx.getLog();
	TextureRenderer		renderer		(m_renderCtx, log, glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP);
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);
	vector<float>		texCoord;

	de::Random			random			(deStringHash(getName()));
	int					offsetX			= random.getInt(0, de::max(0,m_renderCtx.getRenderTarget().getWidth()	- 64));
	int					offsetY			= random.getInt(0, de::max(0,m_renderCtx.getRenderTarget().getHeight()	- 64));

	createTexture();

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		computeQuadTexCoordCube	(texCoord, (tcu::CubeFace)face);

		glViewport				(offsetX, offsetY, viewportWidth, viewportHeight);

		renderer.renderQuad		(0, &texCoord[0], glu::TextureTestUtil::TEXTURETYPE_CUBE);
		glu::readPixels			(m_renderCtx, offsetX, offsetY, renderedFrame.getAccess());

		bool isOk = compareToConstantColor(log, "Result", "Image comparison result", renderedFrame, tcu::COMPARE_LOG_RESULT, m_compareColor);

		if (!isOk)
			allFacesOk = false;
	}

	m_testCtx.setTestResult(allFacesOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allFacesOk ? "Pass"					: "Image comparison failed");
	return STOP;
}